

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.cpp
# Opt level: O2

void __thiscall
CaptureETCaptureRValueLeft::~CaptureETCaptureRValueLeft(CaptureETCaptureRValueLeft *this)

{
  testinator::Test::~Test(&this->super_Test);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(ETCaptureRValueLeft, Capture)
{
  testinator::TestRegistry r;
  ostringstream oss;
  std::unique_ptr<testinator::Outputter> op =
    make_unique<testinator::DefaultOutputter>(oss);

  TestETCaptureRValueLeft myTestA(r, "A");
  testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

  static string expected = "1 == 0";
  return oss.str().find(expected) != string::npos;
}